

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusservicewatcher.cpp
# Opt level: O3

void __thiscall
QDBusServiceWatcher::QDBusServiceWatcher
          (QDBusServiceWatcher *this,QString *service,QDBusConnection *connection,
          WatchMode watchMode,QObject *parent)

{
  QDBusServiceWatcherPrivate *this_00;
  QObjectPrivate *pQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QObjectPrivate *)operator_new(0xa0);
  QObjectPrivate::QObjectPrivate(pQVar1,0x60a00);
  *(undefined ***)pQVar1 = &PTR__QDBusServiceWatcherPrivate_001bf2f0;
  *(undefined8 *)(pQVar1 + 0x78) = 0;
  *(undefined8 *)(pQVar1 + 0x80) = 0;
  *(undefined8 *)(pQVar1 + 0x88) = 0;
  QDBusConnection::QDBusConnection((QDBusConnection *)(pQVar1 + 0x90),connection);
  *(QFlagsStorageHelper<QDBusServiceWatcher::WatchModeFlag,_4> *)(pQVar1 + 0x98) =
       watchMode.super_QFlagsStorageHelper<QDBusServiceWatcher::WatchModeFlag,_4>.
       super_QFlagsStorage<QDBusServiceWatcher::WatchModeFlag>.i;
  QObject::QObject(&this->super_QObject,pQVar1,parent);
  *(undefined ***)this = &PTR_metaObject_001bf1b0;
  this_00 = *(QDBusServiceWatcherPrivate **)&this->field_0x8;
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)&local_58,0,service);
  QList<QString>::end((QList<QString> *)&local_58);
  QDBusServiceWatcherPrivate::setConnection(this_00,(QStringList *)&local_58,connection,watchMode);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDBusServiceWatcher::QDBusServiceWatcher(const QString &service, const QDBusConnection &connection, WatchMode watchMode, QObject *parent)
    : QObject(*new QDBusServiceWatcherPrivate(connection, watchMode), parent)
{
    d_func()->setConnection(QStringList() << service, connection, watchMode);
}